

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::CheckboxFlags(char *label,uint *flags,uint flags_value)

{
  bool bVar1;
  uint uVar2;
  bool v;
  bool local_11;
  
  local_11 = (flags_value & ~*flags) == 0;
  bVar1 = Checkbox(label,&local_11);
  if (bVar1) {
    if (local_11 == true) {
      uVar2 = flags_value | *flags;
    }
    else {
      uVar2 = ~flags_value & *flags;
    }
    *flags = uVar2;
  }
  return bVar1;
}

Assistant:

bool ImGui::CheckboxFlags(const char* label, unsigned int* flags, unsigned int flags_value)
{
    bool v = ((*flags & flags_value) == flags_value);
    bool pressed = Checkbox(label, &v);
    if (pressed)
    {
        if (v)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }

    return pressed;
}